

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::DeriveData(PClassActor *this,PClass *newclass)

{
  bool bVar1;
  PType *this_00;
  PSymbolTable *this_01;
  PClassActor *newa;
  PClass *newclass_local;
  PClassActor *this_local;
  
  bVar1 = DObject::IsKindOf((DObject *)newclass,RegistrationInfo.MyClass);
  if (!bVar1) {
    __assert_fail("newclass->IsKindOf(RUNTIME_CLASS(PClassActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/info.cpp"
                  ,0x133,"virtual void PClassActor::DeriveData(PClass *)");
  }
  *(uint8_t *)
   ((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject + 0x1d) = this->DefaultStateUsage;
  FString::operator=((FString *)
                     ((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                             super_PCompoundType.super_PType.Symbols.Symbols + 0x10),&this->Obituary
                    );
  FString::operator=((FString *)
                     &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                      super_PCompoundType.super_PType.MemberOnly,&this->HitObituary);
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  mDescriptiveName.Chars = (char *)this->DeathHeight;
  *(double *)
   &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    loadOp = this->BurnHeight;
  *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
   &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    Conversions.Array = (this->BloodColor).field_0;
  *(int *)((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType
                  .super_PType.Conversions.Array + 4) = this->GibHealth;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  Conversions.Most = this->WoundHealth;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  PredType = (PType *)this->FastSpeed;
  newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
  VisitNext = (PType *)this->RDFactor;
  *(double *)
   &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    PredConv = this->CameraHeight;
  FSoundID::operator=((FSoundID *)
                      &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.Outer,
                      &this->HowlSound);
  FName::operator=((FName *)((long)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                                    Outer + 4),&this->BloodType);
  FName::operator=(&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.TypeName,
                   &this->BloodType2);
  FName::operator=((FName *)&newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                             field_0xa4,&this->BloodType3);
  *(FIntCVar **)&newclass[1].super_PNativeStruct.super_PStruct.HasNativeFields = this->distancecheck
  ;
  newclass[1].super_PNativeStruct.super_PStruct.Fields.Array = (PField **)this->DropItems;
  *(byte *)&newclass[1].SpecialInits.Array = this->DontHurtShooter & 1;
  *(int *)((long)&newclass[1].SpecialInits.Array + 4) = this->ExplosionRadius;
  newclass[1].SpecialInits.Most = this->ExplosionDamage;
  newclass[1].SpecialInits.Count = this->MeleeDamage;
  FSoundID::operator=((FSoundID *)&newclass[1].ParentClass,&this->MeleeSound);
  FName::operator=((FName *)((long)&newclass[1].ParentClass + 4),&this->MissileName);
  newclass[1].Pointers = (size_t *)this->MissileHeight;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::operator=
            ((TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *)
             &newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
              super_PType.Symbols.Symbols,&this->VisibleToPlayerClass);
  if (this->DamageFactors != (DmgFactors *)0x0) {
    this_00 = (PType *)operator_new(0x18);
    DmgFactors::DmgFactors((DmgFactors *)this_00);
    newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    HashNext = this_00;
    DmgFactors::operator=
              ((DmgFactors *)
               newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.HashNext,this->DamageFactors);
  }
  if (this->PainChances != (PainChanceList *)0x0) {
    this_01 = (PSymbolTable *)operator_new(0x18);
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::TMap
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)this_01);
    newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
    Symbols.ParentSymbolTable = this_01;
    TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::operator=
              ((TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *)
               newclass[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.Symbols.ParentSymbolTable,this->PainChances);
  }
  return;
}

Assistant:

void PClassActor::DeriveData(PClass *newclass)
{
	assert(newclass->IsKindOf(RUNTIME_CLASS(PClassActor)));
	PClassActor *newa = static_cast<PClassActor *>(newclass);

	newa->DefaultStateUsage = DefaultStateUsage;
	newa->Obituary = Obituary;
	newa->HitObituary = HitObituary;
	newa->DeathHeight = DeathHeight;
	newa->BurnHeight = BurnHeight;
	newa->BloodColor = BloodColor;
	newa->GibHealth = GibHealth;
	newa->WoundHealth = WoundHealth;
	newa->FastSpeed = FastSpeed;
	newa->RDFactor = RDFactor;
	newa->CameraHeight = CameraHeight;
	newa->HowlSound = HowlSound;
	newa->BloodType = BloodType;
	newa->BloodType2 = BloodType2;
	newa->BloodType3 = BloodType3;
	newa->distancecheck = distancecheck;

	newa->DropItems = DropItems;

	newa->DontHurtShooter = DontHurtShooter;
	newa->ExplosionRadius = ExplosionRadius;
	newa->ExplosionDamage = ExplosionDamage;
	newa->MeleeDamage = MeleeDamage;
	newa->MeleeSound = MeleeSound;
	newa->MissileName = MissileName;
	newa->MissileHeight = MissileHeight;

	newa->VisibleToPlayerClass = VisibleToPlayerClass;

	if (DamageFactors != NULL)
	{
		// copy damage factors from parent
		newa->DamageFactors = new DmgFactors;
		*newa->DamageFactors = *DamageFactors;
	}
	if (PainChances != NULL)
	{
		// copy pain chances from parent
		newa->PainChances = new PainChanceList;
		*newa->PainChances = *PainChances;
	}

}